

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

void Fraig_TableResizeF(Fraig_HashTable_t *p,int fUseSimR)

{
  uint uVar1;
  Fraig_Node_t **__s;
  Fraig_Node_t *local_60;
  Fraig_Node_t *local_58;
  uint local_4c;
  uint Key;
  abctime clk;
  int local_38;
  int i;
  int Counter;
  int nBinsNew;
  Fraig_Node_t *pEnt2;
  Fraig_Node_t *pEnt;
  Fraig_Node_t **pBinsNew;
  int fUseSimR_local;
  Fraig_HashTable_t *p_local;
  
  Abc_Clock();
  uVar1 = Abc_PrimeCudd(p->nBins << 1);
  __s = (Fraig_Node_t **)malloc((long)(int)uVar1 << 3);
  memset(__s,0,(long)(int)uVar1 << 3);
  local_38 = 0;
  for (clk._4_4_ = 0; clk._4_4_ < p->nBins; clk._4_4_ = clk._4_4_ + 1) {
    pEnt2 = p->pBins[clk._4_4_];
    if (pEnt2 == (Fraig_Node_t *)0x0) {
      local_58 = (Fraig_Node_t *)0x0;
    }
    else {
      local_58 = pEnt2->pNextF;
    }
    _Counter = local_58;
    while (pEnt2 != (Fraig_Node_t *)0x0) {
      if (fUseSimR == 0) {
        local_4c = pEnt2->uHashD;
      }
      else {
        local_4c = pEnt2->uHashR;
      }
      local_4c = local_4c % uVar1;
      pEnt2->pNextF = __s[local_4c];
      __s[local_4c] = pEnt2;
      local_38 = local_38 + 1;
      pEnt2 = _Counter;
      if (_Counter == (Fraig_Node_t *)0x0) {
        local_60 = (Fraig_Node_t *)0x0;
      }
      else {
        local_60 = _Counter->pNextF;
      }
      _Counter = local_60;
    }
  }
  if (local_38 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x14a,"void Fraig_TableResizeF(Fraig_HashTable_t *, int)");
  }
  if (p->pBins != (Fraig_Node_t **)0x0) {
    free(p->pBins);
    p->pBins = (Fraig_Node_t **)0x0;
  }
  p->pBins = __s;
  p->nBins = uVar1;
  return;
}

Assistant:

void Fraig_TableResizeF( Fraig_HashTable_t * p, int fUseSimR )
{
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    abctime clk;
    unsigned Key;

clk = Abc_Clock();
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( p->pBins[i], pEnt, pEnt2 )
        {
            if ( fUseSimR )
                Key = pEnt->uHashR % nBinsNew;
            else
                Key = pEnt->uHashD % nBinsNew;
            pEnt->pNextF = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
//    printf( "Increasing the functional table size from %6d to %6d. ", p->nBins, nBinsNew );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}